

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::RegisterUseByOnCallOrExpectCall(void *mock_obj,char *file,int line)

{
  mapped_type *pmVar1;
  TestInfo *pTVar2;
  char *pcVar3;
  int in_EDX;
  char *in_RSI;
  TestInfo *test_info;
  MockObjectState *state;
  MutexLock l;
  MutexBase *in_stack_ffffffffffffff88;
  GTestMutexLock *in_stack_ffffffffffffff90;
  mapped_type *this;
  key_type *in_stack_ffffffffffffffc8;
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_stack_ffffffffffffffd0;
  
  internal::GTestMutexLock::GTestMutexLock(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  anon_unknown_18::MockObjectRegistry::states
            ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  pmVar1 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (pmVar1->first_used_file == (char *)0x0) {
    pmVar1->first_used_file = in_RSI;
    pmVar1->first_used_line = in_EDX;
    this = pmVar1;
    UnitTest::GetInstance();
    pTVar2 = UnitTest::current_test_info((UnitTest *)this);
    if (pTVar2 != (TestInfo *)0x0) {
      pcVar3 = TestInfo::test_case_name((TestInfo *)0x321fc7);
      std::__cxx11::string::operator=((string *)&pmVar1->first_used_test_case,pcVar3);
      pcVar3 = TestInfo::name((TestInfo *)0x321fed);
      std::__cxx11::string::operator=((string *)&pmVar1->first_used_test,pcVar3);
    }
  }
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x322031);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  MockObjectState& state = g_mock_object_registry.states()[mock_obj];
  if (state.first_used_file == NULL) {
    state.first_used_file = file;
    state.first_used_line = line;
    const TestInfo* const test_info =
        UnitTest::GetInstance()->current_test_info();
    if (test_info != NULL) {
      // TODO(wan@google.com): record the test case name when the
      // ON_CALL or EXPECT_CALL is invoked from SetUpTestCase() or
      // TearDownTestCase().
      state.first_used_test_case = test_info->test_case_name();
      state.first_used_test = test_info->name();
    }
  }
}